

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckBlockSignature
          (SharedValidator *this,Location *loc,Opcode opcode,Type sig_type,
          TypeVector *out_param_types,TypeVector *out_result_types)

{
  bool bVar1;
  char *pcVar2;
  TypeVector local_e0;
  Enum local_c4;
  Var local_c0;
  Enum local_74;
  undefined1 local_70 [8];
  FuncType func_type;
  Index sig_index;
  TypeVector *out_result_types_local;
  TypeVector *out_param_types_local;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode local_10;
  Type sig_type_local;
  Opcode opcode_local;
  Result result;
  
  this_local._4_4_ = sig_type.enum_;
  local_10.enum_ = opcode.enum_;
  Result::Result((Result *)&sig_type_local,Ok);
  bVar1 = Type::IsIndex((Type *)((long)&this_local + 4));
  if (bVar1) {
    func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         Type::GetIndex((Type *)((long)&this_local + 4));
    FuncType::FuncType((FuncType *)local_70);
    Var::Var(&local_c0,
             func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,loc);
    local_74 = (Enum)CheckFuncTypeIndex(this,&local_c0,(FuncType *)local_70);
    Result::operator|=((Result *)&sig_type_local,(Result)local_74);
    Var::~Var(&local_c0);
    bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_70);
    if (!bVar1) {
      bVar1 = Features::multi_value_enabled((Features *)this);
      if (!bVar1) {
        pcVar2 = Opcode::GetName(&local_10);
        local_c4 = (Enum)PrintError(this,loc,"%s params not currently supported.",pcVar2);
        Result::operator|=((Result *)&sig_type_local,(Result)local_c4);
      }
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_param_types,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_70);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_result_types,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
               &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    FuncType::~FuncType((FuncType *)local_70);
  }
  else {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(out_param_types);
    Type::GetInlineVector(&local_e0,(Type *)((long)&this_local + 4));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(out_result_types,&local_e0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_e0);
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result SharedValidator::CheckBlockSignature(const Location& loc,
                                            Opcode opcode,
                                            Type sig_type,
                                            TypeVector* out_param_types,
                                            TypeVector* out_result_types) {
  Result result = Result::Ok;

  if (sig_type.IsIndex()) {
    Index sig_index = sig_type.GetIndex();
    FuncType func_type;
    result |= CheckFuncTypeIndex(Var(sig_index, loc), &func_type);

    if (!func_type.params.empty() && !options_.features.multi_value_enabled()) {
      result |= PrintError(loc, "%s params not currently supported.",
                           opcode.GetName());
    }
    // Multiple results without --enable-multi-value is checked above in
    // OnType.

    *out_param_types = func_type.params;
    *out_result_types = func_type.results;
  } else {
    out_param_types->clear();
    *out_result_types = sig_type.GetInlineVector();
  }

  return result;
}